

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# laszip_dll.cpp
# Opt level: O2

laszip_I32 laszip_get_warning(laszip_POINTER pointer,laszip_CHAR **warning)

{
  if (pointer != (laszip_POINTER)0x0) {
    *warning = (laszip_CHAR *)((long)pointer + 0x648);
    return 0;
  }
  return 1;
}

Assistant:

LASZIP_API laszip_I32
laszip_get_warning(
    laszip_POINTER                     pointer
    , laszip_CHAR**                    warning
)
{
  if (pointer == 0) return 1;
  laszip_dll_struct* laszip_dll = (laszip_dll_struct*)pointer;

  try
  {
    *warning = laszip_dll->warning;
  }
  catch (...)
  {
    snprintf(laszip_dll->error, sizeof(laszip_dll->error), "internal error in laszip_get_warning");
    return 1;
  }

  return 0;
}